

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

basic_ostream<char,_std::char_traits<char>_> *
ghc::filesystem::operator<<(basic_ostream<char,_std::char_traits<char>_> *os,path *p)

{
  char cVar1;
  bool bVar2;
  reference pcVar3;
  path *in_RSI;
  ostream *in_RDI;
  char c;
  iterator __end0;
  iterator __begin0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ps;
  allocator<char> *in_stack_ffffffffffffff80;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  string *local_50;
  allocator<char> local_31;
  string local_30 [32];
  path *local_10;
  ostream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::operator<<(in_RDI,"\"");
  std::allocator<char>::allocator();
  path::string<char,std::char_traits<char>,std::allocator<char>>(local_10,in_stack_ffffffffffffff80)
  ;
  std::allocator<char>::~allocator(&local_31);
  local_50 = local_30;
  local_58._M_current = (char *)std::__cxx11::string::begin();
  local_60._M_current = (char *)std::__cxx11::string::end();
  while( true ) {
    bVar2 = __gnu_cxx::operator!=(&local_58,&local_60);
    if (!bVar2) break;
    pcVar3 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_58);
    cVar1 = *pcVar3;
    if ((cVar1 == '\"') || (cVar1 == '\\')) {
      std::operator<<(local_8,'\\');
    }
    std::operator<<(local_8,cVar1);
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_58);
  }
  std::operator<<(local_8,"\"");
  std::__cxx11::string::~string(local_30);
  return local_8;
}

Assistant:

inline std::basic_ostream<charT, traits>& operator<<(std::basic_ostream<charT, traits>& os, const path& p)
{
    os << "\"";
    auto ps = p.string<charT, traits>();
    for (auto c : ps) {
        if (c == '"' || c == '\\') {
            os << '\\';
        }
        os << c;
    }
    os << "\"";
    return os;
}